

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O3

uint __thiscall ON_OutlineFigure::GetUpToFourPointsOnFigure(ON_OutlineFigure *this,ON_2fPoint *p)

{
  int iVar1;
  bool bVar2;
  ON__UINT32 OVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ON_2fPoint candidate_p;
  ON_2fPoint prev_p;
  ON_2fPoint p0;
  uint local_64;
  ON_2fPoint local_60;
  ON_2fPoint local_58;
  ulong local_50;
  uint local_44;
  ulong local_40;
  ON_2fPoint local_38;
  
  if (p == (ON_2fPoint *)0x0) {
    local_64 = 0;
  }
  else {
    local_64 = 0;
    OVar3 = Internal_FigureEndDex(this,false);
    if (OVar3 != 0) {
      uVar5 = (ulong)OVar3;
      local_58 = ((this->m_points).m_a)->m_point;
      *p = local_58;
      local_50 = (ulong)(OVar3 >> 1);
      uVar4 = (OVar3 >> 1) - 1;
      local_64 = 1;
      local_38 = local_58;
      if (uVar4 != 0 && 3 < OVar3) {
        uVar7 = (ulong)uVar4;
        lVar8 = uVar7 * 0xc;
        do {
          uVar7 = uVar7 - 1;
          bVar2 = ON_OutlineFigurePoint::IsOnFigure
                            ((ON_OutlineFigurePoint *)
                             (&((this->m_points).m_a)->m_point_type + lVar8));
          if (bVar2) {
            local_60 = *(ON_2fPoint *)((long)&(((this->m_points).m_a)->m_point).x + lVar8);
            bVar2 = ON_2fPoint::operator!=(&local_58,&local_60);
            if (bVar2) {
              local_58 = local_60;
              p[1] = local_60;
              local_64 = 2;
              break;
            }
          }
          lVar8 = lVar8 + -0xc;
        } while ((int)uVar7 != 0);
      }
      iVar1 = (int)local_50;
      local_44 = OVar3 + 1;
      lVar8 = local_50 * 0xc;
      iVar6 = 0;
      local_40 = uVar5;
      do {
        bVar2 = ON_OutlineFigurePoint::IsOnFigure
                          ((ON_OutlineFigurePoint *)(&((this->m_points).m_a)->m_point_type + lVar8))
        ;
        if (bVar2) {
          local_60 = *(ON_2fPoint *)((long)&(((this->m_points).m_a)->m_point).x + lVar8);
          bVar2 = ON_2fPoint::operator!=(&local_58,&local_60);
          if (bVar2) {
            local_58 = local_60;
            uVar7 = (ulong)local_64;
            local_64 = local_64 + 1;
            p[uVar7] = local_60;
            uVar4 = (int)local_50 - iVar6;
            break;
          }
        }
        iVar6 = iVar6 + -1;
        lVar8 = lVar8 + 0xc;
        uVar4 = local_44;
      } while (~OVar3 + iVar1 != iVar6);
      if (uVar4 < OVar3) {
        lVar8 = local_40 * 0xc;
        do {
          bVar2 = ON_OutlineFigurePoint::IsOnFigure
                            ((ON_OutlineFigurePoint *)
                             (&((this->m_points).m_a)->m_point_type + lVar8));
          if (bVar2) {
            local_60 = *(ON_2fPoint *)((long)&(((this->m_points).m_a)->m_point).x + lVar8);
            bVar2 = ON_2fPoint::operator!=(&local_58,&local_60);
            if ((bVar2) && (bVar2 = ON_2fPoint::operator!=(&local_38,&local_60), bVar2)) {
              uVar5 = (ulong)local_64;
              local_64 = local_64 + 1;
              p[uVar5] = local_60;
              break;
            }
          }
          lVar8 = lVar8 + -0xc;
          uVar9 = (int)uVar5 - 1;
          uVar5 = (ulong)uVar9;
        } while (uVar4 < uVar9);
      }
      if (3 < local_64) {
        return local_64;
      }
    }
    uVar5 = (ulong)local_64;
    do {
      p[uVar5] = ON_2fPoint::NanPoint;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 4);
  }
  return local_64;
}

Assistant:

unsigned ON_OutlineFigure::GetUpToFourPointsOnFigure(ON_2fPoint p[4]) const
{
  if (nullptr == p)
    return 0;
  
  unsigned point_count = 0;
  const ON__UINT32 end_dex = Internal_FigureEndDex(false);
  if (end_dex > 0)
  {
    // p[0] = point at the start
    const ON_2fPoint p0 = this->m_points[0].m_point;
    p[point_count++] = p0;


    // p[1] = point between start and middle
    ON_2fPoint prev_p = p0;
    unsigned i1 = end_dex / 2;
    if (i1 >= 2)
    {
      for (ON__UINT32 i = i1 - 1; i > 0; --i)
      {
        if (false == this->m_points[i].IsOnFigure())
          continue;
        const ON_2fPoint candidate_p = this->m_points[i].m_point;
        if (prev_p != candidate_p)
        {
          prev_p = candidate_p;
          p[point_count++] = candidate_p;
          break;
        }
      }
    }

    // p[2] = point between middle and end
    for (/*empty init*/; i1 <= end_dex; ++i1)
    {
      if (false == this->m_points[i1].IsOnFigure())
        continue;
      const ON_2fPoint candidate_p = this->m_points[i1].m_point;
      if (prev_p != candidate_p)
      {
        prev_p = candidate_p;
        p[point_count++] = candidate_p;
        break;
      }
    }

    // p[3] = point close to end
    for (ON__UINT32 i = end_dex; i > i1; --i)
    {
      if (false == this->m_points[i].IsOnFigure())
        continue;
      const ON_2fPoint candidate_p = this->m_points[i].m_point;
      if (prev_p != candidate_p && p0 != candidate_p)
      {
        p[point_count++] = candidate_p;
        break;
      }
    }
  }

  for (unsigned i = point_count; i < 4; ++i)
    p[i] = ON_2fPoint::NanPoint;
  return point_count;
}